

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O1

void Abc_TruthRpoPerform(Rpo_TtStore_t *p,int nThreshold,int fVerbose)

{
  Vec_Str_t *__ptr;
  clock_t cVar1;
  Literal_t *__ptr_00;
  clock_t cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  cVar1 = clock();
  iVar3 = p->nFuncs;
  if (iVar3 < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (fVerbose != 0) {
        Abc_Print(-2,"%d: ",(ulong)((int)lVar5 + 1));
      }
      __ptr_00 = Rpo_Factorize((uint *)p->pFuncs[lVar5],p->nVars,nThreshold,fVerbose);
      if (__ptr_00 == (Literal_t *)0x0) {
        if (fVerbose != 0) {
          Abc_Print(-2,"null\n");
          Abc_Print(-2,"\n\n");
        }
      }
      else {
        if (fVerbose != 0) {
          Abc_Print(-2,"Solution : %s\n",__ptr_00->expression->pArray);
          Abc_Print(-2,"\n\n");
        }
        if (__ptr_00->function != (uint *)0x0) {
          free(__ptr_00->function);
          __ptr_00->function = (uint *)0x0;
        }
        if (__ptr_00->transition != (uint *)0x0) {
          free(__ptr_00->transition);
          __ptr_00->transition = (uint *)0x0;
        }
        __ptr = __ptr_00->expression;
        if (__ptr->pArray != (char *)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (char *)0x0;
        }
        if (__ptr != (Vec_Str_t *)0x0) {
          free(__ptr);
        }
        free(__ptr_00);
        uVar4 = uVar4 + 1;
      }
      lVar5 = lVar5 + 1;
      iVar3 = p->nFuncs;
    } while (lVar5 < iVar3);
  }
  Abc_Print(-2,"%d of %d (%.2f %%) functions are RPO.\n",
            (double)(((float)(int)uVar4 * 100.0) / (float)iVar3),(ulong)uVar4);
  cVar2 = clock();
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(cVar2 - cVar1) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthRpoPerform(Rpo_TtStore_t * p, int nThreshold, int fVerbose) {
    clock_t clk = clock();
    int i;
    int rpoCount = 0;
    Literal_t* lit;
    float percent;
    for (i = 0; i < p->nFuncs; i++) {
//        if(i>1000) {
//            continue;
//        }
////        
//        if(i!= 2196 ) { //5886
//            continue;
//        }
        if(fVerbose) {
            Abc_Print(-2,"%d: ", i+1);
        }
            
        lit = Rpo_Factorize((unsigned *) p->pFuncs[i], p->nVars, nThreshold, fVerbose);
        if (lit != NULL) {
            if(fVerbose) {
                Abc_Print(-2, "Solution : %s\n", lit->expression->pArray);
                Abc_Print(-2, "\n\n");
            }
            Lit_Free(lit);
            rpoCount++;
        } else {
            if(fVerbose) {
                Abc_Print(-2, "null\n");
                Abc_Print(-2, "\n\n");
            }
        }
    }
    percent = (rpoCount * 100.0) / p->nFuncs;
    Abc_Print(-2,"%d of %d (%.2f %%) functions are RPO.\n", rpoCount,p->nFuncs,percent);
    Abc_PrintTime(1, "Time", clock() - clk);
}